

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O0

void __thiscall Codecc::Codecc(Codecc *this,size_t maxPacketSize)

{
  shared_ptr<hwnet::Buffer> local_28;
  size_t local_18;
  size_t maxPacketSize_local;
  Codecc *this_local;
  
  local_18 = maxPacketSize;
  maxPacketSize_local = (size_t)this;
  std::shared_ptr<hwnet::Buffer>::shared_ptr(&this->buffer);
  this->w = 0;
  this->r = 0;
  this->maxPacketSize = local_18;
  hwnet::Buffer::New((size_t)&local_28,local_18 * 2);
  std::shared_ptr<hwnet::Buffer>::operator=(&this->buffer,&local_28);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr(&local_28);
  return;
}

Assistant:

Codecc(size_t maxPacketSize):w(0),r(0),maxPacketSize(maxPacketSize) {
		this->buffer = Buffer::New(maxPacketSize*2,maxPacketSize*2);
	}